

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_ops.h
# Opt level: O2

mat<float,_3UL> * hmi::invert<float>(mat<float,_3UL> *__return_storage_ptr__,mat<float,_3UL> *input)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar9 = (input->field_0).data[2][2];
  fVar1 = (input->field_0).data[2][1];
  fVar2 = (input->field_0).data[1][1];
  fVar3 = (input->field_0).data[1][2];
  fVar10 = fVar2 * fVar9 - fVar3 * fVar1;
  (__return_storage_ptr__->field_0).data[0][0] = fVar10;
  fVar4 = (input->field_0).data[0][1];
  fVar5 = (input->field_0).data[0][2];
  (__return_storage_ptr__->field_0).data[0][1] = -(fVar4 * fVar9 - fVar5 * fVar1);
  (__return_storage_ptr__->field_0).data[0][2] = fVar4 * fVar3 - fVar5 * fVar2;
  fVar6 = (input->field_0).data[1][0];
  fVar7 = (input->field_0).data[2][0];
  fVar11 = fVar6 * fVar9 - fVar3 * fVar7;
  (__return_storage_ptr__->field_0).data[1][0] = -fVar11;
  fVar8 = (input->field_0).data[0][0];
  (__return_storage_ptr__->field_0).data[1][1] = fVar9 * fVar8 - fVar5 * fVar7;
  (__return_storage_ptr__->field_0).data[1][2] = -(fVar3 * fVar8 - fVar5 * fVar6);
  fVar9 = fVar6 * fVar1 - fVar2 * fVar7;
  (__return_storage_ptr__->field_0).data[2][0] = fVar9;
  (__return_storage_ptr__->field_0).data[2][1] = -(fVar1 * fVar8 - fVar7 * fVar4);
  (__return_storage_ptr__->field_0).data[2][2] = fVar8 * fVar2 - fVar4 * fVar6;
  operator/=(__return_storage_ptr__,fVar9 * fVar5 + (fVar10 * fVar8 - fVar11 * fVar4));
  return __return_storage_ptr__;
}

Assistant:

constexpr
  mat<T, 3> invert(const mat<T, 3>& input) {
    mat<T, 3> result;

    result.xx = input.yy * input.zz - input.zy * input.yz;
    result.xy = - (input.xy * input.zz - input.zy * input.xz);
    result.xz = input.xy * input.yz - input.yy * input.xz;
    result.yx = - (input.yx * input.zz - input.zx * input.yz);
    result.yy = input.xx * input.zz - input.zx * input.xz;
    result.yz = - (input.xx * input.yz - input.yx * input.xz);
    result.zx = input.yx * input.zy - input.zx * input.yy;
    result.zy = - (input.xx * input.zy - input.zx * input.xy);
    result.zz = input.xx * input.yy - input.yx * input.xy;

    T det = input.xx * result.xx + input.xy * result.yx + input.xz * result.zx;
    result /= det;
    return result;
  }